

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialRuntimeObjects.cpp
# Opt level: O1

void __thiscall Lodtalk::SpecialRuntimeObjects::~SpecialRuntimeObjects(SpecialRuntimeObjects *this)

{
  pointer ppCVar1;
  pointer pOVar2;
  
  ppCVar1 = (this->specialClassTable).
            super__Vector_base<Lodtalk::ClassDescription_*,_std::allocator<Lodtalk::ClassDescription_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar1 != (pointer)0x0) {
    operator_delete(ppCVar1);
  }
  pOVar2 = (this->specialObjectTable).
           super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pOVar2 != (pointer)0x0) {
    operator_delete(pOVar2);
    return;
  }
  return;
}

Assistant:

SpecialRuntimeObjects::~SpecialRuntimeObjects()
{
}